

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_doors.cpp
# Opt level: O0

bool EV_SlidingDoor(line_t_conflict *line,AActor *actor,int tag,int speed,int delay)

{
  line_t_conflict *line_00;
  bool bVar1;
  FTextureID FVar2;
  int iVar3;
  DSectorEffect *this;
  FDoorAnimation *pFVar4;
  DAnimatedDoor *pDVar5;
  sector_t_conflict *psVar6;
  size_t sVar7;
  FDoorAnimation *anim_1;
  int i;
  FSectorTagIterator it;
  FDoorAnimation *anim;
  DAnimatedDoor *door;
  bool rtn;
  int secnum;
  sector_t *sec;
  int delay_local;
  int speed_local;
  int tag_local;
  AActor *actor_local;
  line_t_conflict *line_local;
  
  line_local._7_1_ = false;
  if (tag == 0) {
    psVar6 = line->backsector;
    bVar1 = TObjPtr<DSectorEffect>::operator!=(&psVar6->ceilingdata,(DSectorEffect *)0x0);
    if (bVar1) {
      if (actor->player == (player_t *)0x0) {
        line_local._7_1_ = false;
      }
      else {
        this = TObjPtr<DSectorEffect>::operator->(&psVar6->ceilingdata);
        bVar1 = DObject::IsA((DObject *)this,DAnimatedDoor::RegistrationInfo.MyClass);
        if ((bVar1) &&
           (pDVar5 = barrier_cast<DAnimatedDoor*,DSectorEffect>(&psVar6->ceilingdata),
           pDVar5->m_Status == 1)) {
          line_local._7_1_ = DAnimatedDoor::StartClosing(pDVar5);
        }
        else {
          line_local._7_1_ = false;
        }
      }
    }
    else {
      FVar2 = side_t::GetTexture(line->sidedef[0],0);
      sVar7 = (size_t)(uint)FVar2.texnum;
      pFVar4 = FTextureManager::FindAnimatedDoor(&TexMan,FVar2);
      if (pFVar4 == (FDoorAnimation *)0x0) {
        line_local._7_1_ = false;
      }
      else {
        pDVar5 = (DAnimatedDoor *)DObject::operator_new((DObject *)0x88,sVar7);
        DAnimatedDoor::DAnimatedDoor(pDVar5,(sector_t *)psVar6,line,speed,delay,pFVar4);
        line_local._7_1_ = true;
      }
    }
  }
  else {
    FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)((long)&anim_1 + 4),tag);
LAB_00547915:
    iVar3 = FSectorTagIterator::Next((FSectorTagIterator *)((long)&anim_1 + 4));
    if (-1 < iVar3) {
      psVar6 = sectors + iVar3;
      bVar1 = TObjPtr<DSectorEffect>::operator!=(&psVar6->ceilingdata,(DSectorEffect *)0x0);
      if (!bVar1) {
        anim_1._0_4_ = 0;
        do {
          bVar1 = false;
          if (tag != 0) {
            bVar1 = (int)anim_1 < psVar6->linecount;
          }
          if (!bVar1) break;
          line_00 = psVar6->lines[(int)anim_1];
          if (line_00->backsector != (sector_t_conflict *)0x0) {
            FVar2 = side_t::GetTexture(line_00->sidedef[0],0);
            sVar7 = (size_t)(uint)FVar2.texnum;
            pFVar4 = FTextureManager::FindAnimatedDoor(&TexMan,FVar2);
            if (pFVar4 != (FDoorAnimation *)0x0) goto code_r0x005479f2;
          }
          anim_1._0_4_ = (int)anim_1 + 1;
        } while( true );
      }
      goto LAB_00547915;
    }
  }
  return line_local._7_1_;
code_r0x005479f2:
  line_local._7_1_ = true;
  pDVar5 = (DAnimatedDoor *)DObject::operator_new((DObject *)0x88,sVar7);
  DAnimatedDoor::DAnimatedDoor(pDVar5,(sector_t *)psVar6,line_00,speed,delay,pFVar4);
  goto LAB_00547915;
}

Assistant:

bool EV_SlidingDoor (line_t *line, AActor *actor, int tag, int speed, int delay)
{
	sector_t *sec;
	int secnum;
	bool rtn;

	secnum = -1;
	rtn = false;

	if (tag == 0)
	{
		// Manual sliding door
		sec = line->backsector;

		// Make sure door isn't already being animated
		if (sec->ceilingdata != NULL)
		{
			if (actor->player == NULL)
				return false;

			if (sec->ceilingdata->IsA (RUNTIME_CLASS(DAnimatedDoor)))
			{
				DAnimatedDoor *door = barrier_cast<DAnimatedDoor *>(sec->ceilingdata);
				if (door->m_Status == DAnimatedDoor::Waiting)
				{
					return door->StartClosing();
				}
			}
			return false;
		}
		FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
		if (anim != NULL)
		{
			new DAnimatedDoor (sec, line, speed, delay, anim);
			return true;
		}
		return false;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sec = &sectors[secnum];
		if (sec->ceilingdata != NULL)
		{
			continue;
		}

		for (int i = 0; tag != 0 && i < sec->linecount; ++i)
		{
			line = sec->lines[i];
			if (line->backsector == NULL)
			{
				continue;
			}
			FDoorAnimation *anim = TexMan.FindAnimatedDoor (line->sidedef[0]->GetTexture(side_t::top));
			if (anim != NULL)
			{
				rtn = true;
				new DAnimatedDoor (sec, line, speed, delay, anim);
				break;
			}
		}
	}
	return rtn;
}